

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_> __thiscall Parser::loop(Parser *this)

{
  logic_error *this_00;
  undefined8 *in_RSI;
  Token local_a8;
  value_type local_90;
  unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_> local_88;
  unique_ptr<Statement,_std::default_delete<Statement>_> local_80;
  Token local_78;
  TokenKind local_60;
  TokenKind lookahead;
  Token local_50;
  undefined1 auStack_38 [8];
  vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  statements;
  Parser *this_local;
  
  auStack_38 = (undefined1  [8])0x0;
  statements.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  statements.
  super__Vector_base<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
  ::vector((vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
            *)auStack_38);
  TokenStream::next(&local_50,(TokenStream *)*in_RSI);
  while( true ) {
    TokenStream::lookahead(&local_78,(TokenStream *)*in_RSI);
    local_60 = local_78.type;
    if (local_78.type == RightBracket) {
      TokenStream::next(&local_a8,(TokenStream *)*in_RSI);
      std::
      make_unique<LoopStatement,std::vector<std::unique_ptr<Statement,std::default_delete<Statement>>,std::allocator<std::unique_ptr<Statement,std::default_delete<Statement>>>>>
                ((vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                  *)this);
      std::
      vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
      ::~vector((vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                 *)auStack_38);
      return (__uniq_ptr_data<LoopStatement,_std::default_delete<LoopStatement>,_true,_true>)
             (__uniq_ptr_data<LoopStatement,_std::default_delete<LoopStatement>,_true,_true>)this;
    }
    if (local_78.type == EndOfFile) break;
    if (local_78.type == LeftBracket) {
      loop((Parser *)&local_88);
      std::unique_ptr<Statement,std::default_delete<Statement>>::
      unique_ptr<LoopStatement,std::default_delete<LoopStatement>,void>
                ((unique_ptr<Statement,std::default_delete<Statement>> *)&local_80,&local_88);
      std::
      vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
      ::push_back((vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                   *)auStack_38,(value_type *)&local_80);
      std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr(&local_80);
      std::unique_ptr<LoopStatement,_std::default_delete<LoopStatement>_>::~unique_ptr(&local_88);
    }
    else {
      single((Parser *)&local_90);
      std::
      vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
      ::push_back((vector<std::unique_ptr<Statement,_std::default_delete<Statement>_>,_std::allocator<std::unique_ptr<Statement,_std::default_delete<Statement>_>_>_>
                   *)auStack_38,&local_90);
      std::unique_ptr<Statement,_std::default_delete<Statement>_>::~unique_ptr(&local_90);
    }
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"Unexpected end of input");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

auto Parser::loop() -> std::unique_ptr<LoopStatement> {
    auto statements = std::vector<std::unique_ptr<Statement>>();
    tokenStream.next(); // Consume left bracket token.

    TokenKind lookahead;
    while ((lookahead = tokenStream.lookahead().type) != TokenKind::RightBracket) {
        if (lookahead == TokenKind::EndOfFile)
            throw std::logic_error("Unexpected end of input");

        if (lookahead == TokenKind::LeftBracket)
            statements.push_back(loop());
        else statements.push_back(single());
    }

    tokenStream.next(); // Consume right bracket token.
    return std::make_unique<LoopStatement>(std::move(statements));
}